

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flooxs_gen.cpp
# Opt level: O0

int get_layer_height(map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                     *my_layer_info,vector<int,_std::allocator<int>_> *layer_order)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  mapped_type *pmVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_28;
  iterator layer_order_it;
  int layer_height;
  vector<int,_std::allocator<int>_> *layer_order_local;
  map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
  *my_layer_info_local;
  
  layer_order_it._M_current._4_4_ = 0;
  local_28._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(layer_order);
  while( true ) {
    local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(layer_order);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar2) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_28);
    pmVar4 = std::
             map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
             ::operator[](my_layer_info,piVar3);
    if (pmVar4->film_type != 'A') {
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_28);
      pmVar4 = std::
               map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
               ::operator[](my_layer_info,piVar3);
      iVar1 = layer_order_it._M_current._4_4_;
      if (pmVar4->film_type != 'Z') {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_28);
        pmVar4 = std::
                 map<int,_layer_data,_std::less<int>,_std::allocator<std::pair<const_int,_layer_data>_>_>
                 ::operator[](my_layer_info,piVar3);
        layer_order_it._M_current._4_4_ = iVar1 + pmVar4->thickness;
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_28,0);
  }
  return layer_order_it._M_current._4_4_;
}

Assistant:

int get_layer_height(std::map<int, layer_data> my_layer_info,
                     std::vector<int> &layer_order)
{
  int layer_height = 0;
  for (auto layer_order_it = layer_order.begin();
       layer_order_it != layer_order.end(); layer_order_it++) {
    if (!((my_layer_info[*layer_order_it].film_type == 'A') ||
          (my_layer_info[*layer_order_it].film_type == 'Z'))) {
      layer_height = layer_height + my_layer_info[*layer_order_it].thickness;
    }
  }
  return layer_height;
}